

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_regions
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  OPJ_BOOL OVar1;
  opj_tccp_t *local_38;
  opj_tccp_t *l_tccp;
  OPJ_UINT32 compno;
  opj_event_mgr *p_manager_local;
  opj_stream_private *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x150c,
                  "OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream == (opj_stream_private *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x150e,
                    "OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                   );
    }
    local_38 = ((p_j2k->m_cp).tcps)->tccps;
    l_tccp._4_4_ = 0;
    while( true ) {
      if (p_j2k->m_private_image->numcomps <= l_tccp._4_4_) {
        return 1;
      }
      if ((local_38->roishift != 0) &&
         (OVar1 = opj_j2k_write_rgn(p_j2k,0,l_tccp._4_4_,p_j2k->m_private_image->numcomps,p_stream,
                                    p_manager), OVar1 == 0)) break;
      local_38 = local_38 + 1;
      l_tccp._4_4_ = l_tccp._4_4_ + 1;
    }
    return 0;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x150d,
                "OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_regions(opj_j2k_t *p_j2k,
                                      struct opj_stream_private *p_stream,
                                      struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 compno;
    const opj_tccp_t *l_tccp = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_tccp = p_j2k->m_cp.tcps->tccps;

    for (compno = 0; compno < p_j2k->m_private_image->numcomps; ++compno)  {
        if (l_tccp->roishift) {

            if (! opj_j2k_write_rgn(p_j2k, 0, compno, p_j2k->m_private_image->numcomps,
                                    p_stream, p_manager)) {
                return OPJ_FALSE;
            }
        }

        ++l_tccp;
    }

    return OPJ_TRUE;
}